

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  short sVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterXsYs<short> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  ImPlotContext *pIVar14;
  int iVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pIVar14 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar15 = pGVar6->Count;
  lVar16 = (long)(((pGVar6->Offset + prim + 1) % iVar15 + iVar15) % iVar15) * (long)pGVar6->Stride;
  sVar3 = *(short *)((long)pGVar6->Xs + lVar16);
  dVar11 = log10((double)(int)*(short *)((long)pGVar6->Ys + lVar16) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar15 = pTVar7->YAxis;
  pIVar8 = pIVar14->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar15].Range.Min;
  IVar2 = pIVar14->PixelRange[iVar15].Min;
  fVar17 = (float)(pIVar14->Mx * ((double)(int)sVar3 - (pIVar8->XAxis).Range.Min) + (double)IVar2.x)
  ;
  fVar18 = (float)(pIVar14->My[iVar15] *
                   (((double)(float)(dVar11 / pIVar14->LogDenY[iVar15]) *
                     (pIVar8->YAxis[iVar15].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar19 = (this->P1).x;
  fVar20 = (this->P1).y;
  auVar22._0_4_ = ~-(uint)(fVar17 <= fVar19) & (uint)fVar17;
  auVar22._4_4_ = ~-(uint)(fVar18 <= fVar20) & (uint)fVar18;
  auVar22._8_4_ = ~-(uint)(fVar19 < fVar17) & (uint)fVar17;
  auVar22._12_4_ = ~-(uint)(fVar20 < fVar18) & (uint)fVar18;
  auVar12._4_4_ = (uint)fVar20 & -(uint)(fVar18 <= fVar20);
  auVar12._0_4_ = (uint)fVar19 & -(uint)(fVar17 <= fVar19);
  auVar12._8_4_ = (uint)fVar19 & -(uint)(fVar19 < fVar17);
  auVar12._12_4_ = (uint)fVar20 & -(uint)(fVar20 < fVar18);
  auVar22 = auVar22 | auVar12;
  fVar21 = (cull_rect->Min).y;
  auVar13._4_8_ = auVar22._8_8_;
  auVar13._0_4_ = -(uint)(auVar22._4_4_ < fVar21);
  auVar23._0_8_ = auVar13._0_8_ << 0x20;
  auVar23._8_4_ = -(uint)(auVar22._8_4_ < (cull_rect->Max).x);
  auVar23._12_4_ = -(uint)(auVar22._12_4_ < (cull_rect->Max).y);
  auVar24._4_4_ = -(uint)(fVar21 < auVar22._4_4_);
  auVar24._0_4_ = -(uint)((cull_rect->Min).x < auVar22._0_4_);
  auVar24._8_8_ = auVar23._8_8_;
  iVar15 = movmskps((int)pIVar8,auVar24);
  if (iVar15 == 0xf) {
    fVar21 = fVar20 + this->HalfWeight;
    fVar20 = fVar20 - this->HalfWeight;
    IVar4 = this->Col;
    IVar2 = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    (pIVar9->pos).x = fVar19;
    (pIVar9->pos).y = fVar21;
    DrawList->_VtxWritePtr->uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar4;
    pIVar9[1].pos.x = fVar17;
    pIVar9[1].pos.y = fVar20;
    DrawList->_VtxWritePtr[1].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = fVar19;
    pIVar9[2].pos.y = fVar20;
    pIVar9[2].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    pIVar9[3].pos.x = fVar17;
    pIVar9[3].pos.y = fVar21;
    pIVar9[3].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar10 = DrawList->_IdxWritePtr;
    *puVar10 = uVar5;
    puVar10[1] = uVar5 + 1;
    puVar10[2] = DrawList->_VtxCurrentIdx + 2;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar10[3] = uVar5;
    puVar10[4] = uVar5 + 1;
    puVar10[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar10 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar20 = fVar17 - this->HalfWeight;
    fVar19 = this->HalfWeight + fVar17;
    fVar21 = (this->P1).y;
    IVar4 = this->Col;
    IVar2 = *uv;
    pIVar9[4].pos.x = fVar20;
    pIVar9[4].pos.y = fVar18;
    DrawList->_VtxWritePtr->uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar4;
    pIVar9[1].pos.x = fVar19;
    pIVar9[1].pos.y = fVar21;
    DrawList->_VtxWritePtr[1].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar4;
    pIVar9[2].pos.x = fVar20;
    pIVar9[2].pos.y = fVar21;
    pIVar9[2].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar4;
    pIVar9[3].pos.x = fVar19;
    pIVar9[3].pos.y = fVar18;
    pIVar9[3].uv = IVar2;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar10 = DrawList->_IdxWritePtr;
    *puVar10 = uVar5;
    puVar10[1] = uVar5 + 1;
    puVar10[2] = DrawList->_VtxCurrentIdx + 2;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar10[3] = uVar5;
    puVar10[4] = uVar5 + 1;
    puVar10[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar10 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar2.y = fVar18;
  IVar2.x = fVar17;
  this->P1 = IVar2;
  return (char)iVar15 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }